

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipState.hpp
# Opt level: O1

void __thiscall
linq::
SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>
::Init(SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>
       *this)

{
  int iVar1;
  ulong uVar2;
  
  this->current = 0;
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(&this->source);
  uVar2 = this->current;
  while( true ) {
    if (this->count <= uVar2) {
      return;
    }
    iVar1 = (*((this->source).source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    if ((char)iVar1 == '\0') break;
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(&this->source);
    uVar2 = this->current + 1;
    this->current = uVar2;
  }
  return;
}

Assistant:

void Init() override final
			{
				current = 0;
				source.Init(); 
				
				while(current < count && source.Valid()) {
					source.Advance();
					current++;
				}
			}